

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O1

bool __thiscall FunctionJITTimeInfo::ForceJITLoopBody(FunctionJITTimeInfo *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  
  uVar3 = GetSourceContextId(this);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,JITLoopBodyPhase,uVar3,(this->m_data).localFuncId);
  if (!bVar1) {
    uVar3 = GetSourceContextId(this);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,FullJitPhase,uVar3,(this->m_data).localFuncId);
    if (!bVar1) {
      bVar1 = JITTimeFunctionBody::IsGenerator((JITTimeFunctionBody *)(this->m_data).bodyData);
      if (!bVar1) {
        bVar1 = JITTimeFunctionBody::HasTry((JITTimeFunctionBody *)(this->m_data).bodyData);
        if (!bVar1) {
          uVar3 = GetSourceContextId(this);
          bVar1 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_015b0240,JITLoopBodyPhase,uVar3,
                             (this->m_data).localFuncId);
          bVar2 = bVar1 | DAT_015c4a8a;
          goto LAB_0043ca4e;
        }
      }
    }
  }
  bVar2 = 0;
LAB_0043ca4e:
  return (bool)(bVar2 & 1);
}

Assistant:

bool
FunctionJITTimeInfo::ForceJITLoopBody() const
{
    return
        !PHASE_OFF(Js::JITLoopBodyPhase, this) &&
        !PHASE_OFF(Js::FullJitPhase, this) &&
        !GetBody()->IsGenerator() &&
        !GetBody()->HasTry() &&
        (
            PHASE_FORCE(Js::JITLoopBodyPhase, this)
#ifdef ENABLE_PREJIT
            || Js::Configuration::Global.flags.Prejit
#endif
            );
}